

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall
CTcTokenizer::log_error_or_warning_with_tok
          (CTcTokenizer *this,tc_severity_t sev,int errnum,CTcToken *tok)

{
  wchar_t wVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  utf8_ptr src;
  char *local_d0;
  size_t rem;
  char buf [128];
  
  src.p_ = (char *)0x0;
  pcVar8 = "\'";
  switch(tok->typ_) {
  case TOKT_EOF:
    sVar3 = 0xd;
    pcVar6 = "<End Of File>";
    goto LAB_0024edef;
  default:
    pcVar6 = tok->text_;
    sVar3 = tok->text_len_;
    goto LAB_0024edef;
  case TOKT_SSTR:
    local_d0 = pcVar8;
    break;
  case TOKT_DSTR:
    pcVar8 = "\"";
    local_d0 = pcVar8;
    break;
  case TOKT_DSTR_START:
    local_d0 = "<<";
    pcVar8 = "\"";
    break;
  case TOKT_DSTR_MID:
    local_d0 = "<<";
    goto LAB_0024ec00;
  case TOKT_DSTR_END:
    local_d0 = "\"";
LAB_0024ec00:
    pcVar8 = ">>";
    break;
  case TOKT_RESTR:
    local_d0 = "\'";
    pcVar8 = "R\'";
  }
  strcpy(buf,pcVar8);
  src.p_ = tok->text_;
  sVar4 = tok->text_len_;
  rem = sVar4;
  sVar3 = strlen(buf);
  pcVar8 = buf + sVar3;
  for (uVar9 = 0; (sVar4 != 0 && (uVar9 < 0x14)); uVar9 = uVar9 + 1) {
    wVar1 = utf8_ptr::s_getch(src.p_);
    if (wVar1 < L' ') {
      *pcVar8 = '\\';
      wVar1 = utf8_ptr::s_getch(src.p_);
      pcVar6 = pcVar8 + 2;
      switch(wVar1) {
      case L'\t':
        pcVar8[1] = 't';
        pcVar8 = pcVar6;
        break;
      case L'\n':
        pcVar8[1] = 'n';
        pcVar8 = pcVar6;
        break;
      case L'\v':
        pcVar8[1] = 'b';
        pcVar8 = pcVar6;
        break;
      default:
        pcVar8[1] = 'x';
        wVar1 = utf8_ptr::s_getch(src.p_);
        uVar2 = (uint)wVar1 >> 0xc & 0xf;
        iVar7 = uVar2 + 0x37;
        if (uVar2 < 10) {
          iVar7 = uVar2 + 0x30;
        }
        sVar4 = utf8_ptr::s_putch(pcVar6,iVar7 + L'0');
        pcVar6 = pcVar6 + sVar4;
        wVar1 = utf8_ptr::s_getch(src.p_);
        uVar2 = (uint)wVar1 >> 8 & 0xf;
        iVar7 = uVar2 + 0x37;
        if (uVar2 < 10) {
          iVar7 = uVar2 + 0x30;
        }
        sVar4 = utf8_ptr::s_putch(pcVar6,iVar7 + L'0');
        wVar1 = utf8_ptr::s_getch(src.p_);
        uVar2 = (uint)wVar1 >> 4 & 0xf;
        iVar7 = uVar2 + 0x37;
        if (uVar2 < 10) {
          iVar7 = uVar2 + 0x30;
        }
        sVar5 = utf8_ptr::s_putch(pcVar6 + sVar4,iVar7 + L'0');
        pcVar8 = pcVar6 + sVar4 + sVar5;
        wVar1 = utf8_ptr::s_getch(src.p_);
        uVar2 = wVar1 & 0xf;
        iVar7 = uVar2 + 0x37;
        if (uVar2 < 10) {
          iVar7 = uVar2 + 0x30;
        }
        wVar1 = iVar7 + L'0';
        goto LAB_0024eca6;
      case L'\r':
        pcVar8[1] = 'r';
        pcVar8 = pcVar6;
        break;
      case L'\x0e':
        pcVar8[1] = 'v';
        pcVar8 = pcVar6;
        break;
      case L'\x0f':
        pcVar8[1] = '^';
        pcVar8 = pcVar6;
        break;
      case L'\x15':
        pcVar8[1] = ' ';
        pcVar8 = pcVar6;
      }
    }
    else {
      wVar1 = utf8_ptr::s_getch(src.p_);
LAB_0024eca6:
      sVar4 = utf8_ptr::s_putch(pcVar8,wVar1);
      pcVar8 = pcVar8 + sVar4;
    }
    utf8_ptr::inc(&src,&rem);
    sVar4 = rem;
  }
  if (sVar4 != 0) {
    pcVar8[0] = '.';
    pcVar8[1] = '.';
    pcVar8[2] = '.';
    pcVar8 = pcVar8 + 3;
  }
  pcVar6 = buf;
  strcpy(pcVar8,local_d0);
  sVar3 = strlen(pcVar6);
LAB_0024edef:
  CTcMain::log_error(G_tcmain,this->last_desc_,this->last_linenum_,sev,errnum,sVar3,pcVar6);
  return;
}

Assistant:

void CTcTokenizer::log_error_or_warning_with_tok(
    tc_severity_t sev, int errnum, const CTcToken *tok)
{
    const char *tok_txt;
    size_t tok_len;
    char buf[128];
    const char *prefix;
    const char *suffix;
    utf8_ptr src;
    utf8_ptr dst;
    size_t rem;
    size_t outchars;

    /* see what we have */
    switch(tok->gettyp())
    {
    case TOKT_SSTR:
        /* show the string in quotes, but limit the length */
        prefix = "'";
        suffix = "'";
        goto format_string;

    case TOKT_DSTR:
        prefix = "\"";
        suffix = "\"";
        goto format_string;
        
    case TOKT_DSTR_START:
        prefix = "\"";
        suffix = "<<";
        goto format_string;
        
    case TOKT_DSTR_MID:
        prefix = ">>";
        suffix = "<<";
        goto format_string;

    case TOKT_DSTR_END:
        prefix = ">>";
        suffix = "\"";
        goto format_string;

    case TOKT_RESTR:
        prefix = "R'";
        suffix = "'";
        goto format_string;

    format_string:
        /* set the prefix */
        strcpy(buf, prefix);
        
        /* 
         *   show the string, but limit the length, and convert control
         *   characters to escaped representation 
         */
        src.set((char *)tok->get_text());
        rem = tok->get_text_len();
        for (dst.set(buf  + strlen(buf)), outchars = 0 ;
             rem != 0 && outchars < 20 ; src.inc(&rem), ++outchars)
        {
            /* if this is a control character, escape it */
            if (src.getch() < 32)
            {
                dst.setch('\\');
                
                switch(src.getch())
                {
                case 10:
                    dst.setch('n');
                    break;

                case 13:
                    dst.setch('r');
                    break;

                case 0x000F:
                    dst.setch('^');
                    break;

                case 0x000E:
                    dst.setch('v');
                    break;

                case 0x000B:
                    dst.setch('b');
                    break;

                case 0x0015:
                    dst.setch(' ');
                    break;

                case 9:
                    dst.setch('t');
                    break;

                default:
                    dst.setch('x');
                    dst.setch('0' + int_to_xdigit((src.getch() >> 12) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch() >> 8) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch() >> 4) & 0xf));
                    dst.setch('0' + int_to_xdigit((src.getch()) & 0xf));
                    break;
                }
            }
            else
            {
                /* put this character as-is */
                dst.setch(src.getch());
            }
        }

        /* if there's more string left, add "..." */
        if (rem != 0)
        {
            dst.setch('.');
            dst.setch('.');
            dst.setch('.');
        }

        /* add the suffix */
        strcpy(dst.getptr(), suffix);

        /* use this buffer as the token string to display */
        tok_txt = buf;
        tok_len = strlen(tok_txt);
        break;

    case TOKT_EOF:
        /* show a special "<End Of File>" marker */
        tok_txt = "<End Of File>";
        tok_len = strlen(tok_txt);
        break;
        
    default:
        /* just show the current token text */
        tok_txt = tok->get_text();
        tok_len = tok->get_text_len();
        break;
    }
    
    /* log the error */
    G_tcmain->log_error(get_last_desc(), get_last_linenum(),
                        sev, errnum, tok_len, tok_txt);
}